

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_int8.h
# Opt level: O3

void ncnn::conv3x3s1_winograd23_transform_kernel_int8_sse
               (Mat *kernel,Mat *kernel_tm,int inch,int outch,Option *opt)

{
  int iVar1;
  void *pvVar2;
  size_t sVar3;
  size_t sVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined8 *puVar15;
  ulong uVar16;
  int iVar17;
  long lVar18;
  undefined8 *puVar19;
  undefined8 *puVar20;
  ulong uVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  short tmp [4] [3];
  undefined8 uStack_50;
  undefined1 local_48 [16];
  undefined8 local_38;
  
  uStack_50 = 0x232141;
  Mat::create(kernel_tm,0x10,inch,outch,2,(Allocator *)0x0);
  auVar14 = _DAT_0054a720;
  if (0 < outch) {
    pvVar2 = kernel->data;
    iVar1 = kernel_tm->w;
    puVar15 = (undefined8 *)kernel_tm->data;
    sVar3 = kernel_tm->elemsize;
    sVar4 = kernel_tm->cstep;
    uVar16 = 0;
    auVar22._8_8_ = 0x100010002;
    auVar22._0_8_ = 0x100010002;
    auVar23._8_8_ = 0xffff00010000;
    auVar23._0_8_ = 0xffff00010000;
    auVar24._8_8_ = 0x2000100010000;
    auVar24._0_8_ = 0x2000100010000;
    do {
      if (0 < inch) {
        iVar17 = inch * 9 * (int)uVar16;
        uVar21 = 0;
        puVar20 = puVar15;
        do {
          lVar18 = uVar21 * 9;
          auVar5 = vpshuflw_avx(ZEXT416((uint)(int)*(char *)((long)pvVar2 + lVar18 + iVar17)),0);
          auVar6 = vpshuflw_avx(ZEXT416((uint)(int)*(char *)((long)pvVar2 +
                                                            lVar18 + (long)iVar17 + 1)),0);
          auVar7 = vpshuflw_avx(ZEXT416((uint)(int)*(char *)((long)pvVar2 +
                                                            lVar18 + (long)iVar17 + 2)),0);
          auVar8 = vpshuflw_avx(ZEXT416((uint)(int)*(char *)((long)pvVar2 +
                                                            lVar18 + (long)iVar17 + 3)),0);
          auVar9 = vpshuflw_avx(ZEXT416((uint)(int)*(char *)((long)pvVar2 +
                                                            lVar18 + (long)iVar17 + 4)),0);
          auVar10 = vpshuflw_avx(ZEXT416((uint)(int)*(char *)((long)pvVar2 +
                                                             lVar18 + (long)iVar17 + 5)),0);
          auVar11 = vpshuflw_avx(ZEXT416((uint)(int)*(char *)((long)pvVar2 +
                                                             lVar18 + (long)iVar17 + 6)),0);
          auVar12 = vpshuflw_avx(ZEXT416((uint)(int)*(char *)((long)pvVar2 +
                                                             lVar18 + (long)iVar17 + 7)),0);
          auVar13 = vpshuflw_avx(ZEXT416((uint)(int)*(char *)((long)pvVar2 +
                                                             lVar18 + (long)iVar17 + 8)),0);
          auVar5 = vpmullw_avx(auVar5,auVar22);
          auVar6 = vpmullw_avx(auVar6,auVar23);
          auVar5 = vpaddw_avx(auVar6,auVar5);
          auVar6 = vpmullw_avx(auVar7,auVar24);
          auVar5 = vpaddw_avx(auVar6,auVar5);
          auVar6 = vpmullw_avx(auVar8,auVar22);
          auVar7 = vpmullw_avx(auVar9,auVar23);
          auVar6 = vpaddw_avx(auVar7,auVar6);
          auVar7 = vpmullw_avx(auVar10,auVar24);
          auVar6 = vpaddw_avx(auVar6,auVar7);
          auVar8 = vpunpcklqdq_avx(auVar5,auVar6);
          auVar5 = vpmullw_avx(auVar11,auVar22);
          auVar6 = vpmullw_avx(auVar12,auVar23);
          auVar5 = vpaddw_avx(auVar6,auVar5);
          auVar6 = vpmullw_avx(auVar13,auVar24);
          auVar5 = vpaddw_avx(auVar5,auVar6);
          auVar6 = vpshufd_avx(auVar8,0xe7);
          auVar7 = vpshuflw_avx(auVar6,0xdc);
          auVar6 = vpshufd_avx(auVar5,0x55);
          auVar6 = vpblendw_avx(auVar7,auVar6,9);
          auVar7 = vpshufb_avx(auVar8,auVar14);
          auVar5 = vpshufd_avx(auVar5,0);
          local_48 = vpblendw_avx(auVar7,auVar5,0x24);
          local_38 = auVar6._0_8_;
          lVar18 = 4;
          puVar19 = puVar20;
          do {
            auVar5 = vpshuflw_avx(ZEXT216(*(ushort *)(local_48 + lVar18 + -4)),0);
            auVar5 = vpmullw_avx(auVar5,ZEXT816(0x100010002));
            auVar6 = vpshuflw_avx(ZEXT216(*(ushort *)(local_48 + lVar18 + -2)),0);
            auVar6 = vpmullw_avx(auVar6,ZEXT816(0xffff00010000));
            auVar5 = vpaddw_avx(auVar6,auVar5);
            auVar6 = vpshuflw_avx(ZEXT216(*(ushort *)(local_48 + lVar18)),0);
            auVar6 = vpmullw_avx(auVar6,ZEXT816(0x2000100010000));
            auVar5 = vpaddw_avx(auVar6,auVar5);
            *puVar19 = auVar5._0_8_;
            puVar19 = puVar19 + 1;
            lVar18 = lVar18 + 6;
          } while (lVar18 != 0x1c);
          uVar21 = uVar21 + 1;
          puVar20 = (undefined8 *)((long)puVar20 + (long)iVar1 * sVar3);
        } while (uVar21 != (uint)inch);
      }
      uVar16 = uVar16 + 1;
      puVar15 = (undefined8 *)((long)puVar15 + sVar4 * sVar3);
    } while (uVar16 != (uint)outch);
  }
  return;
}

Assistant:

static void conv3x3s1_winograd23_transform_kernel_int8_sse(const Mat& kernel, Mat& kernel_tm, int inch, int outch, const Option& opt)
{
    kernel_tm.create(4 * 4, inch, outch, (size_t)2u);

    // G
    const short ktm[4][3] = {
        {2, 0, 0},
        {1, 1, 1},
        {1, -1, 1},
        {0, 0, 2}
    };

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        for (int q = 0; q < inch; q++)
        {
            const signed char* kernel0 = (const signed char*)kernel + p * inch * 9 + q * 9;
            short* kernel_tm0 = kernel_tm.channel(p).row<short>(q);

            // transform kernel
            const signed char* k0 = kernel0;
            const signed char* k1 = kernel0 + 3;
            const signed char* k2 = kernel0 + 6;

            // h
            short tmp[4][3];
            for (int i = 0; i < 4; i++)
            {
                tmp[i][0] = (short)k0[0] * ktm[i][0] + k0[1] * ktm[i][1] + k0[2] * ktm[i][2];
                tmp[i][1] = (short)k1[0] * ktm[i][0] + k1[1] * ktm[i][1] + k1[2] * ktm[i][2];
                tmp[i][2] = (short)k2[0] * ktm[i][0] + k2[1] * ktm[i][1] + k2[2] * ktm[i][2];
            }

            // U
            for (int j = 0; j < 4; j++)
            {
                short* tmpp = &tmp[j][0];

                for (int i = 0; i < 4; i++)
                {
                    kernel_tm0[j * 4 + i] = tmpp[0] * ktm[i][0] + tmpp[1] * ktm[i][1] + tmpp[2] * ktm[i][2];
                }
            }
        }
    }
}